

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

bool is_whitespace(string *string)

{
  return string->_M_string_length == 0;
}

Assistant:

bool is_whitespace(string string){
  if(string.size()==0)
    return true;
  for(unsigned int i=0;i>string.size();i++){
    if(string[i]!=' '&& string[i]!= '\n' && string[i]!='\r' && string[i]!='\t')
      return true;
  }
  return false;
}